

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextNextGenBase.hpp
# Opt level: O0

ICommandQueueType * __thiscall
Diligent::DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::LockCommandQueue
          (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  SoftwareQueueIndex QueueInd;
  Char *Message;
  RenderDeviceVkImpl *this_00;
  ICommandQueueVk *pIVar2;
  undefined1 local_30 [8];
  string msg;
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    (&this->super_DeviceContextBase<Diligent::EngineVkImplTraits>);
  if (bVar1) {
    FormatString<char[52]>
              ((string *)local_30,
               (char (*) [52])"Deferred contexts have no associated command queues");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"LockCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/DeviceContextNextGenBase.hpp"
               ,0x44);
    std::__cxx11::string::~string((string *)local_30);
  }
  this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextBase<Diligent::EngineVkImplTraits>).m_pDevice);
  QueueInd = GetCommandQueueId(this);
  pIVar2 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::LockCommandQueue(&this_00->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,QueueInd);
  return pIVar2;
}

Assistant:

LockCommandQueue() override final
    {
        DEV_CHECK_ERR(!this->IsDeferred(), "Deferred contexts have no associated command queues");
        return this->m_pDevice->LockCommandQueue(this->GetCommandQueueId());
    }